

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<QTextCursorPrivate*,QHashDummyValue>::emplace<QHashDummyValue_const&>
          (QHash<QTextCursorPrivate*,QHashDummyValue> *this,QTextCursorPrivate **key,
          QHashDummyValue *args)

{
  Data<QHashPrivate::Node<QTextCursorPrivate_*,_QHashDummyValue>_> *pDVar1;
  long in_FS_OFFSET;
  piter pVar2;
  QHash<QTextCursorPrivate_*,_QHashDummyValue> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data<QHashPrivate::Node<QTextCursorPrivate_*,_QHashDummyValue>_> **)this;
  if (pDVar1 == (Data<QHashPrivate::Node<QTextCursorPrivate_*,_QHashDummyValue>_> *)0x0) {
    local_28.d = (Data<QHashPrivate::Node<QTextCursorPrivate_*,_QHashDummyValue>_> *)0x0;
LAB_004d7ebb:
    pDVar1 = (Data<QHashPrivate::Node<QTextCursorPrivate_*,_QHashDummyValue>_> *)0x0;
LAB_004d7edc:
    pDVar1 = QHashPrivate::Data<QHashPrivate::Node<QTextCursorPrivate_*,_QHashDummyValue>_>::
             detached(pDVar1);
    *(Data<QHashPrivate::Node<QTextCursorPrivate_*,_QHashDummyValue>_> **)this = pDVar1;
  }
  else {
    if ((uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i < 2) {
      if (pDVar1->size < pDVar1->numBuckets >> 1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          pVar2 = (piter)emplace_helper<QHashDummyValue_const&>(this,key,args);
          return (iterator)pVar2;
        }
      }
      else {
        pVar2 = (piter)QHash<QTextCursorPrivate_*,_QHashDummyValue>::emplace_helper<QHashDummyValue>
                                 ((QHash<QTextCursorPrivate_*,_QHashDummyValue> *)this,key,
                                  (QHashDummyValue *)&local_28);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          return (iterator)pVar2;
        }
      }
      goto LAB_004d7f3e;
    }
    local_28.d = pDVar1;
    if ((pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
      LOCK();
      (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      pDVar1 = *(Data<QHashPrivate::Node<QTextCursorPrivate_*,_QHashDummyValue>_> **)this;
      if (pDVar1 == (Data<QHashPrivate::Node<QTextCursorPrivate_*,_QHashDummyValue>_> *)0x0)
      goto LAB_004d7ebb;
    }
    if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) goto LAB_004d7edc;
  }
  pVar2 = (piter)emplace_helper<QHashDummyValue_const&>(this,key,args);
  QHash<QTextCursorPrivate_*,_QHashDummyValue>::~QHash(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar2;
  }
LAB_004d7f3e:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }